

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O1

void __thiscall xray_re::cse_abstract::~cse_abstract(cse_abstract *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_cse_abstract = (_func_int **)&PTR__cse_abstract_002458e0;
  std::
  _Deque_base<xray_re::cse_abstract::sm_record,_std::allocator<xray_re::cse_abstract::sm_record>_>::
  ~_Deque_base((_Deque_base<xray_re::cse_abstract::sm_record,_std::allocator<xray_re::cse_abstract::sm_record>_>
                *)&this->m_markers);
  pcVar1 = (this->m_ini_string)._M_dataplus._M_p;
  paVar2 = &(this->m_ini_string).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->m_s_name)._M_dataplus._M_p;
  paVar2 = &(this->m_s_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->m_s_name_replace)._M_dataplus._M_p;
  paVar2 = &(this->m_s_name_replace).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

cse_abstract::~cse_abstract() {}